

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnCatchAllExpr(BinaryReaderIR *this)

{
  Location local_b8;
  Catch local_98;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  
  local_18 = this;
  GetLocation(&local_b8,this);
  Catch::Catch(&local_98,&local_b8);
  this_local._4_4_ = AppendCatch(this,&local_98);
  Catch::~Catch(&local_98);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnCatchAllExpr() {
  return AppendCatch(Catch(GetLocation()));
}